

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O3

string * __thiscall
cmExportTryCompileFileGenerator::FindTargets
          (string *__return_storage_ptr__,cmExportTryCompileFileGenerator *this,string *propName,
          cmGeneratorTarget *tgt,string *language,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *emitted)

{
  pointer *pppcVar1;
  pointer pcVar2;
  iterator __position;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  this_00;
  char *pcVar3;
  cmLocalGenerator *pcVar4;
  string *psVar5;
  _Rb_tree_node_base *p_Var6;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar7;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmGeneratorTarget *target;
  cmGeneratorExpression ge;
  string local_858;
  cmListFileBacktrace local_838;
  cmGeneratorExpressionDAGChecker dagChecker;
  cmTarget dummyHead;
  cmGeneratorTarget gDummyHead;
  
  pcVar3 = cmGeneratorTarget::GetProperty(tgt,propName);
  if (pcVar3 == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_838.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_838.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmGeneratorExpression::cmGeneratorExpression(&ge,&local_838);
    if (local_838.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_838.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pcVar2 = (propName->_M_dataplus)._M_p;
    local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_858,pcVar2,pcVar2 + propName->_M_string_length);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&dagChecker,tgt,&local_858,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_858._M_dataplus._M_p != &local_858.field_2) {
      operator_delete(local_858._M_dataplus._M_p,local_858.field_2._M_allocated_capacity + 1);
    }
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(char *)&ge);
    gDummyHead.Target = (cmTarget *)&gDummyHead.LocalGenerator;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&gDummyHead,"try_compile_dummy_exe","");
    cmTarget::cmTarget(&dummyHead,(string *)&gDummyHead,EXECUTABLE,VisibilityNormal,
                       tgt->Target->Makefile);
    if (gDummyHead.Target != (cmTarget *)&gDummyHead.LocalGenerator) {
      operator_delete(gDummyHead.Target,
                      (ulong)((long)&(gDummyHead.LocalGenerator)->_vptr_cmLocalGenerator + 1));
    }
    pcVar4 = cmGeneratorTarget::GetLocalGenerator(tgt);
    cmGeneratorTarget::cmGeneratorTarget(&gDummyHead,&dummyHead,pcVar4);
    this_00 = cge;
    pcVar4 = cmGeneratorTarget::GetLocalGenerator(tgt);
    psVar5 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)
                        this_00._M_t.
                        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                        .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
                        pcVar4,&this->Config,false,&gDummyHead,tgt,&dagChecker,language);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (psVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar5->_M_string_length);
    p_Var6 = *(_Rb_tree_node_base **)
              ((long)cge._M_t.
                     super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                     .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl +
              0x98);
    if (p_Var6 != (_Rb_tree_node_base *)
                  ((long)cge._M_t.
                         super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                         .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl
                  + 0x88)) {
      do {
        target = *(cmGeneratorTarget **)(p_Var6 + 1);
        pVar7 = std::
                _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                ::_M_insert_unique<cmGeneratorTarget_const*const&>
                          ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                            *)emitted,&target);
        if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          __position._M_current =
               (this->Exports).
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->Exports).
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
            _M_realloc_insert<cmGeneratorTarget_const*const&>
                      ((vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)
                       &this->Exports,__position,&target);
          }
          else {
            *__position._M_current = target;
            pppcVar1 = &(this->Exports).
                        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppcVar1 = *pppcVar1 + 1;
          }
        }
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      } while (p_Var6 != (_Rb_tree_node_base *)
                         ((long)cge._M_t.
                                super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                                _M_head_impl + 0x88));
    }
    cmGeneratorTarget::~cmGeneratorTarget(&gDummyHead);
    cmTarget::~cmTarget(&dummyHead);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr(&cge);
    if (dagChecker.Backtrace.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (dagChecker.Backtrace.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&dagChecker.Seen._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dagChecker.Property._M_dataplus._M_p != &dagChecker.Property.field_2) {
      operator_delete(dagChecker.Property._M_dataplus._M_p,
                      dagChecker.Property.field_2._M_allocated_capacity + 1);
    }
    cmGeneratorExpression::~cmGeneratorExpression(&ge);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportTryCompileFileGenerator::FindTargets(
  const std::string& propName, cmGeneratorTarget const* tgt,
  std::string const& language, std::set<cmGeneratorTarget const*>& emitted)
{
  const char* prop = tgt->GetProperty(propName);
  if (!prop) {
    return std::string();
  }

  cmGeneratorExpression ge;

  cmGeneratorExpressionDAGChecker dagChecker(tgt, propName, nullptr, nullptr);

  std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(prop);

  cmTarget dummyHead("try_compile_dummy_exe", cmStateEnums::EXECUTABLE,
                     cmTarget::VisibilityNormal, tgt->Target->GetMakefile());

  cmGeneratorTarget gDummyHead(&dummyHead, tgt->GetLocalGenerator());

  std::string result =
    cge->Evaluate(tgt->GetLocalGenerator(), this->Config, false, &gDummyHead,
                  tgt, &dagChecker, language);

  const std::set<cmGeneratorTarget const*>& allTargets =
    cge->GetAllTargetsSeen();
  for (cmGeneratorTarget const* target : allTargets) {
    if (emitted.insert(target).second) {
      this->Exports.push_back(target);
    }
  }
  return result;
}